

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O1

void formula_free(rpf_t *rpf)

{
  rpf_t *prVar1;
  
  if (rpf != (rpf_t *)0x0) {
    do {
      if (rpf->type == TYPE_VALUE) {
        free(rpf->value);
      }
      prVar1 = rpf->next;
      free(rpf);
      rpf = prVar1;
    } while (prVar1 != (rpf_t *)0x0);
  }
  return;
}

Assistant:

void formula_free(struct rpf_t *rpf)
{
  for (; rpf;)
  {
    struct rpf_t *tmp;
    switch (rpf->type)
    {
      case TYPE_VALUE:
        free(rpf->value);
        break;
      case TYPE_VARIABLE:
        break;
      default:
        break;
    }
    tmp = rpf->next;
    free(rpf);
    rpf = tmp;
  }
}